

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O2

int pci_open_resource(char *pci_addr,char *resource,int flags)

{
  int iVar1;
  int *piVar2;
  char buf [512];
  char path [4096];
  
  snprintf(path,0x1000,"/sys/bus/pci/devices/%s/%s",pci_addr,resource);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Opening PCI resource at %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x3a,
          "pci_open_resource",path);
  iVar1 = open(path,flags);
  if (iVar1 != -1) {
    return iVar1;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  __xpg_strerror_r(iVar1,buf,0x200);
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x3b,
          "pci_open_resource","open pci resource",buf);
  exit(iVar1);
}

Assistant:

int pci_open_resource(const char* pci_addr, const char* resource, int flags) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/%s", pci_addr, resource);
	debug("Opening PCI resource at %s", path);
	int fd = check_err(open(path, flags), "open pci resource");
	return fd;
}